

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint gf_mul(uint a,uint b)

{
  uint local_18;
  uint sum;
  uint b_local;
  uint a_local;
  
  if ((a == 0) || (b == 0)) {
    b_local = 0;
  }
  else {
    local_18 = index_of[a] + index_of[b];
    if (0xfe < local_18) {
      local_18 = local_18 - 0xff;
    }
    b_local = alpha_of[local_18];
  }
  return b_local;
}

Assistant:

uint32_t gf_mul(uint32_t a, uint32_t b)
{
    uint32_t sum;
    if (a == 0 || b == 0)
        return 0;
    if (a < 0 || b < 0)
        return -1;
    sum = index_of[a] + index_of[b]; // вычисляем сумму индексов полиномов
    if (sum >= GFsize - 1)
        sum -= GFsize - 1; // приводим сумму к модулю GF
    return alpha_of[sum];  // переводим результат в полиномиальную...
                           // ...форму и возвращаем результат
}